

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

MatroskaTrackEncodingCompAlgo
MATROSKA_TrackGetBlockCompression(matroska_trackentry *TrackEntry,int ForProfile)

{
  bool_t bVar1;
  ebml_context *peVar2;
  ebml_master *peVar3;
  ebml_integer *peVar4;
  ulong uVar5;
  int64_t iVar6;
  ebml_element *Elt2;
  ebml_element *Elt;
  ebml_element *Encodings;
  int ForProfile_local;
  matroska_trackentry *TrackEntry_local;
  
  bVar1 = Node_IsPartOf(TrackEntry,0x45544b4d);
  if (bVar1 != 0) {
    peVar2 = MATROSKA_getContextContentEncodings();
    peVar3 = (ebml_master *)EBML_MasterFindFirstElt(&TrackEntry->Base,peVar2,0,0,0);
    if (peVar3 == (ebml_master *)0x0) {
      TrackEntry_local._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
    }
    else {
      peVar2 = MATROSKA_getContextContentEncoding();
      peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
      if (peVar3 == (ebml_master *)0x0) {
        TrackEntry_local._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
      }
      else {
        peVar2 = MATROSKA_getContextContentEncodingScope();
        peVar4 = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
        uVar5 = EBML_IntegerValue(peVar4);
        if ((uVar5 & 1) == 0) {
          TrackEntry_local._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
        }
        else {
          peVar2 = MATROSKA_getContextContentCompression();
          peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,0,0,0);
          if (peVar3 == (ebml_master *)0x0) {
            TrackEntry_local._4_4_ = MATROSKA_TRACK_ENCODING_COMP_NONE;
          }
          else {
            peVar2 = MATROSKA_getContextContentCompAlgo();
            peVar4 = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
            iVar6 = EBML_IntegerValue(peVar4);
            TrackEntry_local._4_4_ = (MatroskaTrackEncodingCompAlgo)iVar6;
          }
        }
      }
    }
    return TrackEntry_local._4_4_;
  }
  __assert_fail("Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x926,
                "MatroskaTrackEncodingCompAlgo MATROSKA_TrackGetBlockCompression(const matroska_trackentry *, int)"
               );
}

Assistant:

MatroskaTrackEncodingCompAlgo MATROSKA_TrackGetBlockCompression(const matroska_trackentry *TrackEntry, int ForProfile)
{
    ebml_element *Encodings, *Elt, *Elt2;
    assert(Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS));
    Encodings = EBML_MasterFindChild(TrackEntry,MATROSKA_getContextContentEncodings());
    if (!Encodings)
        return MATROSKA_TRACK_ENCODING_COMP_NONE;
    Elt2 = EBML_MasterFindChild((ebml_master*)Encodings,MATROSKA_getContextContentEncoding());
    if (!Elt2)
        return MATROSKA_TRACK_ENCODING_COMP_NONE;
    Elt =  EBML_MasterGetChild((ebml_master*)Elt2,MATROSKA_getContextContentEncodingScope(), ForProfile);
    if (!(EBML_IntegerValue((ebml_integer*)Elt) & MATROSKA_CONTENTENCODINGSCOPE_BLOCK))
        return MATROSKA_TRACK_ENCODING_COMP_NONE;
    Elt =  EBML_MasterFindChild((ebml_master*)Elt2,MATROSKA_getContextContentCompression());
    if (!Elt)
        return MATROSKA_TRACK_ENCODING_COMP_NONE;
    Elt2 = EBML_MasterGetChild((ebml_master*)Elt,MATROSKA_getContextContentCompAlgo(), ForProfile);
    return (MatroskaTrackEncodingCompAlgo)EBML_IntegerValue((ebml_integer*)Elt2);
}